

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::DumpFunctionId(FunctionBody *this,bool pad)

{
  Type TVar1;
  uint uVar2;
  SourceContextInfo *pSVar3;
  Type TVar4;
  LocalFunctionId LVar5;
  char16_t *pcVar6;
  char16_t *pcVar7;
  
  pSVar3 = (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
             m_srcInfo).ptr)->sourceContextInfo).ptr;
  uVar2 = pSVar3->sourceContextId;
  if (uVar2 != 0xffffffff) {
    pcVar7 = L"#%d.%d";
    if (pad) {
      pcVar7 = L"%2d.%-3d";
    }
    LVar5 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    Output::Print(pcVar7,(ulong)uVar2,(ulong)LVar5);
    return;
  }
  TVar4 = pSVar3->dwHostSourceContext;
  TVar1 = pSVar3->isHostDynamicDocument;
  LVar5 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  if ((TVar4 == 0xffffffffffffffff) || ((TVar1 & 1U) != 0)) {
    pcVar6 = L"Dy.%-3d";
    pcVar7 = L"Dyn#%d";
  }
  else {
    pcVar6 = L"%-5d";
    pcVar7 = L"#%d";
  }
  if (pad) {
    pcVar7 = pcVar6;
  }
  Output::Print(pcVar7,(ulong)LVar5);
  return;
}

Assistant:

void FunctionBody::DumpFunctionId(bool pad)
    {
        uint sourceContextId = this->GetSourceContextInfo()->sourceContextId;
        if (sourceContextId == Js::Constants::NoSourceContext)
        {
            if (this->IsDynamicScript())
            {
                Output::Print(pad? _u("Dy.%-3d") : _u("Dyn#%d"), this->GetLocalFunctionId());
            }
            else
            {
                // Function from LoadFile
                Output::Print(pad? _u("%-5d") : _u("#%d"), this->GetLocalFunctionId());
            }
        }
        else
        {
            Output::Print(pad? _u("%2d.%-3d") : _u("#%d.%d"), sourceContextId, this->GetLocalFunctionId());
        }
    }